

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O2

void __thiscall
std::experimental::optional_base<std::weak_ptr<SyntaxTree>_>::~optional_base
          (optional_base<std::weak_ptr<SyntaxTree>_> *this)

{
  if (this->init_ == true) {
    __weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
              (&(this->storage_).value_.super___weak_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    return;
  }
  return;
}

Assistant:

~optional_base() { if (init_) storage_.value_.T::~T(); }